

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

ssize_t __thiscall qpdf::pl::Count::write(Count *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  if (__buf != (void *)0x0) {
    if (this->str != (string *)0x0) {
      std::__cxx11::string::append((char *)this->str,CONCAT44(in_register_00000034,__fd));
      return extraout_RAX;
    }
    this->count = this->count + (long)__buf;
    in_RAX = 0;
    if (this->pass_immediately_to_next == true) {
      iVar1 = (*((this->super_Pipeline).next_)->_vptr_Pipeline[2])();
      return CONCAT44(extraout_var,iVar1);
    }
  }
  return in_RAX;
}

Assistant:

void
        write(unsigned char const* buf, size_t len) final
        {
            if (len) {
                if (str) {
                    str->append(reinterpret_cast<char const*>(buf), len);
                    return;
                }
                count += static_cast<qpdf_offset_t>(len);
                if (pass_immediately_to_next) {
                    next()->write(buf, len);
                }
            }
        }